

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void __thiscall
r_exec::View::View(View *this,SyncMode sync,uint64_t ijt,double sln,int64_t res,Code *destination,
                  Code *origin,Code *object,double act)

{
  Atom local_48 [4];
  Atom local_44 [4];
  double local_40;
  double local_38;
  
  local_40 = act;
  local_38 = sln;
  r_code::View::View(&this->super_View);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_001c1618;
  (this->controller).object = (_Object *)0x0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_groupMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_groupMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  r_code::Atom::SSet((ushort)local_44,(uchar)Opcodes::PgmView);
  r_code::Atom::operator=((Atom *)&(this->super_View).field_0x28,local_44);
  r_code::Atom::~Atom(local_44);
  init(this,(EVP_PKEY_CTX *)(ulong)sync);
  r_code::Atom::Float((float)local_40);
  r_code::Atom::operator=((Atom *)&(this->super_View).field_0x44,local_48);
  r_code::Atom::~Atom(local_48);
  return;
}

Assistant:

View::View(SyncMode sync,
           uint64_t ijt,
           double sln,
           int64_t res,
           Code *destination,
           Code *origin,
           Code *object,
           double act): r_code::View(), controller(nullptr)
{
    code(VIEW_OPCODE) = Atom::SSet(Opcodes::PgmView, PGM_VIEW_ARITY);
    init(sync, ijt, sln, res, destination, origin, object);
    code(VIEW_ACT) = Atom::Float(act);
}